

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer::~Layer(Layer *this)

{
  Layer *in_RDI;
  
  ~Layer(in_RDI);
  operator_delete(in_RDI,0xb8);
  return;
}

Assistant:

Layer::~Layer()
{
}